

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

void teleds(int nux,int nuy,boolean allow_drag)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  bool local_1e;
  boolean local_1d;
  xchar local_1c;
  xchar local_1b;
  xchar local_1a;
  xchar local_19;
  int iStack_18;
  boolean cause_delay;
  xchar chainy;
  xchar chainx;
  xchar bally;
  xchar ballx;
  int bc_control;
  boolean ball_still_in_range;
  boolean ball_active;
  int iStack_c;
  boolean allow_drag_local;
  int nuy_local;
  int nux_local;
  
  local_1e = false;
  if (uball != (obj *)0x0) {
    local_1e = uball->where != '\0';
  }
  bally = local_1e;
  chainx = '\0';
  ballx = allow_drag;
  bc_control = nuy;
  iStack_c = nux;
  if (local_1e != false) {
    if ((uball->where == '\x03') ||
       (iVar3 = distmin(nux,nuy,(int)uball->ox,(int)uball->oy), 2 < iVar3)) {
      if ((ballx == '\0') || (iVar3 = distmin((int)u.ux,(int)u.uy,iStack_c,bc_control), 1 < iVar3))
      {
        ballx = '\0';
        unplacebc();
      }
    }
    else {
      chainx = '\x01';
    }
  }
  u.utrap = 0;
  u.ustuck = (monst *)0x0;
  u.ux0 = u.ux;
  u.uy0 = u.uy;
  if (((youmonst.data)->mflags1 & 0x80) == 0) {
    if ((youmonst.data)->mlet == '9') {
      u._1052_1_ = u._1052_1_ & 0x7f;
      bVar1 = is_pool(level,iStack_c,bc_control);
      u._1052_1_ = u._1052_1_ & 0xfb | (bVar1 & 1) << 2;
    }
    else {
      u._1052_1_ = u._1052_1_ & 0x7b;
      if ((youmonst.data)->mlet == '\r') {
        youmonst.m_ap_type = '\0';
      }
    }
  }
  else {
    u._1052_1_ = u._1052_1_ & 0x7b | (level->objects[iStack_c][bc_control] != (obj *)0x0) << 2;
  }
  if ((u._1052_1_ & 1) != 0) {
    u._1052_1_ = u._1052_1_ & 0xfe;
    u.uswldtim = 0;
    if ((uball != (obj *)0x0) && (bally == '\0')) {
      bally = '\x01';
      ballx = '\0';
    }
    doredraw();
  }
  if ((bally != '\0') &&
     (((chainx != '\0' || (ballx != '\0')) &&
      (bVar2 = drag_ball((xchar)iStack_c,(xchar)bc_control,&stack0xffffffffffffffe8,&local_19,
                         &local_1a,&local_1b,&local_1c,&local_1d,ballx), bVar2 != '\0')))) {
    move_bc(0,iStack_18,local_19,local_1a,local_1b,local_1c);
  }
  u.ux = (xchar)iStack_c;
  u.uy = (xchar)bc_control;
  fill_pit(level,(int)u.ux0,(int)u.uy0);
  if (((bally != '\0') && (chainx == '\0')) && (ballx == '\0')) {
    placebc();
  }
  initrack();
  update_player_regions(level);
  if (u.usteed != (monst *)0x0) {
    (u.usteed)->mx = (xchar)iStack_c;
    (u.usteed)->my = (xchar)bc_control;
  }
  newsym((int)u.ux0,(int)u.uy0);
  see_monsters();
  vision_full_recalc = '\x01';
  nomul(0,(char *)0x0);
  vision_recalc(0);
  spoteffects('\x01');
  invocation_message();
  return;
}

Assistant:

void teleds(int nux, int nuy, boolean allow_drag)
{
	boolean ball_active = (Punished && uball->where != OBJ_FREE),
		ball_still_in_range = FALSE;

	/* If they have to move the ball, then drag if allow_drag is true;
	 * otherwise they are teleporting, so unplacebc().  
	 * If they don't have to move the ball, then always "drag" whether or
	 * not allow_drag is true, because we are calling that function, not
	 * to drag, but to move the chain.  *However* there are some dumb
	 * special cases:
	 *    0				 0
	 *   _X  move east       ----->  X_
	 *    @				  @
	 * These are permissible if teleporting, but not if dragging.  As a
	 * result, drag_ball() needs to know about allow_drag and might end
	 * up dragging the ball anyway.  Also, drag_ball() might find that
	 * dragging the ball is completely impossible (ball in range but there's
	 * rock in the way), in which case it teleports the ball on its own.
	 */
	if (ball_active) {
	    if (!carried(uball) && distmin(nux, nuy, uball->ox, uball->oy) <= 2)
		ball_still_in_range = TRUE; /* don't have to move the ball */
	    else {
		/* have to move the ball */
		if (!allow_drag || distmin(u.ux, u.uy, nux, nuy) > 1) {
		    /* we should not have dist > 1 and allow_drag at the same
		     * time, but just in case, we must then revert to teleport.
		     */
		    allow_drag = FALSE;
		    unplacebc();
		}
	    }
	}
	u.utrap = 0;
	u.ustuck = 0;
	u.uwilldrown = 0;
	u.ux0 = u.ux;
	u.uy0 = u.uy;

	if (hides_under(youmonst.data))
		u.uundetected = OBJ_AT(nux, nuy);
	else if (youmonst.data->mlet == S_EEL)
		u.uundetected = is_pool(level, nux, nuy);
	else {
		u.uundetected = 0;
		/* mimics stop being unnoticed */
		if (youmonst.data->mlet == S_MIMIC)
		    youmonst.m_ap_type = M_AP_NOTHING;
	}

	if (u.uswallow) {
		u.uswldtim = u.uswallow = 0;
		if (Punished && !ball_active) {
		    /* ensure ball placement, like unstuck */
		    ball_active = TRUE;
		    allow_drag = FALSE;
		}
		doredraw();
	}
	if (ball_active) {
	    if (ball_still_in_range || allow_drag) {
		int bc_control;
		xchar ballx, bally, chainx, chainy;
		boolean cause_delay;

		if (drag_ball(nux, nuy, &bc_control, &ballx, &bally,
				    &chainx, &chainy, &cause_delay, allow_drag))
		    move_bc(0, bc_control, ballx, bally, chainx, chainy);
	    }
	}
	/* must set u.ux, u.uy after drag_ball(), which may need to know
	   the old position if allow_drag is true... */
	u.ux = nux;
	u.uy = nuy;
	fill_pit(level, u.ux0, u.uy0);
	if (ball_active) {
	    if (!ball_still_in_range && !allow_drag)
		placebc();
	}
	initrack(); /* teleports mess up tracking monsters without this */
	update_player_regions(level);
	/* Move your steed, too */
	if (u.usteed) {
		u.usteed->mx = nux;
		u.usteed->my = nuy;
	}

	/*
	 *  Make sure the hero disappears from the old location.  This will
	 *  not happen if she is teleported within sight of her previous
	 *  location.  Force a full vision recalculation because the hero
	 *  is now in a new location.
	 */
	newsym(u.ux0,u.uy0);
	see_monsters();
	vision_full_recalc = 1;
	nomul(0, NULL);
	vision_recalc(0);	/* vision before effects */
	spoteffects(TRUE);
	invocation_message();
}